

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTarget.cxx
# Opt level: O3

void __thiscall cmTarget::CheckProperty(cmTarget *this,string *prop,cmMakefile *context)

{
  pointer pcVar1;
  long *plVar2;
  bool bVar3;
  int iVar4;
  char *pcVar5;
  ostream *poVar6;
  ostringstream e;
  string local_228;
  long *local_208 [2];
  long local_1f8 [2];
  long *local_1e8 [2];
  long local_1d8 [2];
  long *local_1c8 [2];
  long local_1b8 [2];
  undefined1 local_1a8 [376];
  
  pcVar1 = (prop->_M_dataplus)._M_p;
  local_1c8[0] = local_1b8;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_1c8,pcVar1,pcVar1 + prop->_M_string_length);
  plVar2 = local_1c8[0];
  iVar4 = strncmp((char *)local_1c8[0],"LINK_INTERFACE_LIBRARIES",0x18);
  if (plVar2 != local_1b8) {
    operator_delete(plVar2,local_1b8[0] + 1);
  }
  if (iVar4 == 0) {
    pcVar5 = GetProperty(this,prop,this->Makefile);
    if (pcVar5 != (char *)0x0) {
      cmTargetCheckLINK_INTERFACE_LIBRARIES(prop,pcVar5,context,false);
    }
  }
  pcVar1 = (prop->_M_dataplus)._M_p;
  local_1e8[0] = local_1d8;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_1e8,pcVar1,pcVar1 + prop->_M_string_length);
  plVar2 = local_1e8[0];
  iVar4 = strncmp((char *)local_1e8[0],"IMPORTED_LINK_INTERFACE_LIBRARIES",0x21);
  if (plVar2 != local_1d8) {
    operator_delete(plVar2,local_1d8[0] + 1);
  }
  if (iVar4 == 0) {
    pcVar5 = GetProperty(this,prop,this->Makefile);
    if (pcVar5 != (char *)0x0) {
      cmTargetCheckLINK_INTERFACE_LIBRARIES(prop,pcVar5,context,true);
    }
  }
  pcVar1 = (prop->_M_dataplus)._M_p;
  local_208[0] = local_1f8;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_208,pcVar1,pcVar1 + prop->_M_string_length);
  plVar2 = local_208[0];
  iVar4 = strncmp((char *)local_208[0],"INTERFACE_LINK_LIBRARIES",0x18);
  if (plVar2 != local_1f8) {
    operator_delete(plVar2,local_1f8[0] + 1);
  }
  if (iVar4 == 0) {
    pcVar5 = GetProperty(this,prop,this->Makefile);
    if (pcVar5 != (char *)0x0) {
      if (cmTargetCheckINTERFACE_LINK_LIBRARIES(char_const*,cmMakefile*)::keys == '\0') {
        iVar4 = __cxa_guard_acquire(&cmTargetCheckINTERFACE_LINK_LIBRARIES(char_const*,cmMakefile*)
                                     ::keys);
        if (iVar4 != 0) {
          cmTargetCheckINTERFACE_LINK_LIBRARIES(char_const*,cmMakefile*)::keys._184_8_ = 0;
          cmsys::RegularExpression::compile
                    ((RegularExpression *)
                     cmTargetCheckINTERFACE_LINK_LIBRARIES(char_const*,cmMakefile*)::keys,
                     "(^|;)(debug|optimized|general)(;|$)");
          __cxa_atexit(cmsys::RegularExpression::~RegularExpression,
                       cmTargetCheckINTERFACE_LINK_LIBRARIES(char_const*,cmMakefile*)::keys,
                       &__dso_handle);
          __cxa_guard_release(&cmTargetCheckINTERFACE_LINK_LIBRARIES(char_const*,cmMakefile*)::keys)
          ;
        }
      }
      bVar3 = cmsys::RegularExpression::find
                        ((RegularExpression *)
                         cmTargetCheckINTERFACE_LINK_LIBRARIES(char_const*,cmMakefile*)::keys,pcVar5
                        );
      if (bVar3) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8,
                   "Property INTERFACE_LINK_LIBRARIES may not contain link-type keyword \"",0x45);
        if (cmTargetCheckINTERFACE_LINK_LIBRARIES(char_const*,cmMakefile*)::keys._16_8_ == 0) {
          local_228._M_dataplus._M_p = (pointer)&local_228.field_2;
          local_228._M_string_length = 0;
          local_228.field_2._M_local_buf[0] = '\0';
        }
        else {
          local_228._M_dataplus._M_p = (pointer)&local_228.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_228,
                     cmTargetCheckINTERFACE_LINK_LIBRARIES(char_const*,cmMakefile*)::keys._16_8_,
                     cmTargetCheckINTERFACE_LINK_LIBRARIES(char_const*,cmMakefile*)::keys._96_8_);
        }
        poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)local_1a8,local_228._M_dataplus._M_p,
                            local_228._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar6,
                   "\".  The INTERFACE_LINK_LIBRARIES property may contain configuration-sensitive generator-expressions which may be used to specify per-configuration rules."
                   ,0x99);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_228._M_dataplus._M_p != &local_228.field_2) {
          operator_delete(local_228._M_dataplus._M_p,
                          CONCAT71(local_228.field_2._M_allocated_capacity._1_7_,
                                   local_228.field_2._M_local_buf[0]) + 1);
        }
        std::__cxx11::stringbuf::str();
        cmMakefile::IssueMessage(context,FATAL_ERROR,&local_228);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_228._M_dataplus._M_p != &local_228.field_2) {
          operator_delete(local_228._M_dataplus._M_p,
                          CONCAT71(local_228.field_2._M_allocated_capacity._1_7_,
                                   local_228.field_2._M_local_buf[0]) + 1);
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
        std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x70));
      }
    }
  }
  return;
}

Assistant:

void cmTarget::CheckProperty(const std::string& prop,
                             cmMakefile* context) const
{
  // Certain properties need checking.
  if(cmHasLiteralPrefix(prop, "LINK_INTERFACE_LIBRARIES"))
    {
    if(const char* value = this->GetProperty(prop))
      {
      cmTargetCheckLINK_INTERFACE_LIBRARIES(prop, value, context, false);
      }
    }
  if(cmHasLiteralPrefix(prop, "IMPORTED_LINK_INTERFACE_LIBRARIES"))
    {
    if(const char* value = this->GetProperty(prop))
      {
      cmTargetCheckLINK_INTERFACE_LIBRARIES(prop, value, context, true);
      }
    }
  if(cmHasLiteralPrefix(prop, "INTERFACE_LINK_LIBRARIES"))
    {
    if(const char* value = this->GetProperty(prop))
      {
      cmTargetCheckINTERFACE_LINK_LIBRARIES(value, context);
      }
    }
}